

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

pool_ptr<soul::AST::Processor> __thiscall
soul::StructuralParser::parseProcessorDecl
          (StructuralParser *this,CodeLocation *keywordLocation,Namespace *ns)

{
  SourceCodeText *local_18;
  undefined8 local_10;
  
  local_18 = (SourceCodeText *)(ns->super_ModuleBase).super_ASTObject._vptr_ASTObject;
  if (local_18 != (SourceCodeText *)0x0) {
    (local_18->super_RefCountedObject).refCount = (local_18->super_RefCountedObject).refCount + 1;
  }
  local_10._0_4_ = (ns->super_ModuleBase).super_ASTObject.objectType;
  local_10._4_4_ = *(undefined4 *)&(ns->super_ModuleBase).super_ASTObject.field_0xc;
  parseTopLevelItem<soul::AST::Processor>
            (this,keywordLocation,(ModuleBase *)&stack0xffffffffffffffe8);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_18);
  return (pool_ptr<soul::AST::Processor>)(Processor *)this;
}

Assistant:

pool_ptr<AST::Processor> parseProcessorDecl (CodeLocation keywordLocation, AST::Namespace&  ns)   { return parseTopLevelItem<AST::Processor> (keywordLocation, ns); }